

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileInitGlobal
          (MultiFileFunction<duckdb::ParquetMultiFileInfo> *this,ClientContext *context,
          TableFunctionInitInput *input)

{
  MultiFileBindData *data;
  pointer pMVar1;
  pointer pMVar2;
  _Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false> _Var3;
  pointer psVar4;
  pointer puVar5;
  TableFilterSet *pTVar6;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var7;
  optional_ptr<duckdb::TableFilterSet,_true> table_filters;
  ulong uVar8;
  pointer pLVar9;
  size_t __n;
  pointer pCVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  int32_t val;
  int iVar13;
  ReaderInitializeType RVar14;
  _Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false> this_00;
  type pMVar15;
  pointer pMVar16;
  pointer pMVar17;
  MultiFileReaderData *pMVar18;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var19;
  TaskScheduler *this_01;
  unsigned_long uVar20;
  pointer pMVar21;
  BaseUnionData *pBVar22;
  BaseFileReader *pBVar23;
  type reader_data;
  MultiFileList *pMVar24;
  idx_t iVar25;
  pointer pMVar26;
  pointer puVar27;
  reference pvVar28;
  const_reference __x;
  iterator iVar29;
  InternalException *pIVar30;
  pointer puVar31;
  LogicalType *column_type;
  pointer puVar32;
  vector<unsigned_long,_true> *__x_00;
  size_type __n_00;
  pointer pLVar33;
  undefined4 uVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBP;
  MultiFileBindData *global_state;
  _Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false> _Var36;
  vector<duckdb::MultiFileColumnDefinition,_true> *pvVar37;
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  uVar38;
  pointer psVar39;
  pointer pCVar40;
  _Head_base<0UL,_duckdb::MultiFileGlobalState_*,_false> local_e0;
  TableFunctionInitInput *local_d8;
  MultiFileList *local_d0;
  vector<duckdb::LogicalType,_true> table_types;
  OpenFileInfo file_name;
  undefined1 local_68 [24];
  idx_t column_id;
  undefined8 local_48;
  optional_idx max_threads;
  optional_idx local_38;
  undefined7 uVar35;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  data = (MultiFileBindData *)(input->bind_data).ptr;
  local_e0._M_head_impl = (MultiFileGlobalState *)0x0;
  local_d8 = input;
  MultiFileFilterPushdown
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)local_68,context,data,
             &input->column_ids,(input->filters).ptr);
  if ((_func_int **)local_68._0_8_ == (_func_int **)0x0) {
    pMVar15 = shared_ptr<duckdb::MultiFileList,_true>::operator*(&data->file_list);
    this_00._M_head_impl = (MultiFileGlobalState *)operator_new(0xe8);
    ((this_00._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
         (_func_int **)&PTR__MultiFileGlobalState_02453b68;
    (this_00._M_head_impl)->file_list = pMVar15;
    ((this_00._M_head_impl)->file_list_scan).current_file_idx = 0xffffffffffffffff;
    ((this_00._M_head_impl)->owned_file_list).
    super_unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>._M_t.
    super___uniq_ptr_impl<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::MultiFileList_*,_std::default_delete<duckdb::MultiFileList>_>.
    super__Head_base<0UL,_duckdb::MultiFileList_*,_false>._M_head_impl = (MultiFileList *)0x0;
    ((this_00._M_head_impl)->multi_file_reader_state).
    super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
    .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl =
         (MultiFileReaderGlobalState *)0x0;
    ((this_00._M_head_impl)->lock).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&((this_00._M_head_impl)->lock).super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&((this_00._M_head_impl)->lock).super___mutex_base._M_mutex + 0x10) = 0;
    ((this_00._M_head_impl)->lock).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    *(undefined8 *)
     ((long)&((this_00._M_head_impl)->lock).super___mutex_base._M_mutex.__data.__list.__prev + 1) =
         0;
    *(undefined8 *)
     ((long)&((this_00._M_head_impl)->lock).super___mutex_base._M_mutex.__data.__list.__next + 1) =
         0;
    (this_00._M_head_impl)->completed_file_index = 0;
    ((this_00._M_head_impl)->readers).
    super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((this_00._M_head_impl)->readers).
    super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((this_00._M_head_impl)->readers).
    super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00._M_head_impl)->batch_index = 0;
    (this_00._M_head_impl)->max_threads = 1;
    ((this_00._M_head_impl)->projection_ids).
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((this_00._M_head_impl)->projection_ids).
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((this_00._M_head_impl)->projection_ids).
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((this_00._M_head_impl)->scanned_types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((this_00._M_head_impl)->scanned_types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((this_00._M_head_impl)->scanned_types).
    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((this_00._M_head_impl)->column_indexes).
    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((this_00._M_head_impl)->column_indexes).
    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((this_00._M_head_impl)->column_indexes).
    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((this_00._M_head_impl)->filters).ptr = (TableFilterSet *)0x0;
    ((this_00._M_head_impl)->global_state).
    super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
    .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
         (GlobalTableFunctionState *)0x0;
    _Var36._M_head_impl = local_e0._M_head_impl;
  }
  else {
    this_00._M_head_impl = (MultiFileGlobalState *)operator_new(0xe8);
    file_name.path._M_dataplus._M_p = (pointer)local_68._0_8_;
    local_68._0_8_ = (_func_int **)0x0;
    MultiFileGlobalState::MultiFileGlobalState
              (this_00._M_head_impl,
               (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
                *)&file_name);
    _Var36._M_head_impl = local_e0._M_head_impl;
    if (file_name.path._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_name.path._M_dataplus._M_p + 8))();
      _Var36._M_head_impl = local_e0._M_head_impl;
    }
  }
  local_e0._M_head_impl = this_00._M_head_impl;
  if (_Var36._M_head_impl != (MultiFileGlobalState *)0x0) {
    (*((_Var36._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])();
  }
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  pMVar24 = pMVar16->file_list;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  MultiFileList::InitializeScan(pMVar24,&pMVar16->file_list_scan);
  pMVar1 = (data->reader_bind).schema.
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (data->reader_bind).schema.
           super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           .
           super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = pMVar24;
  pMVar17 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
            ::operator->(&data->multi_file_reader);
  pvVar37 = &(data->reader_bind).schema;
  if (pMVar1 == pMVar2) {
    pvVar37 = &data->columns;
  }
  local_68._16_8_ = &local_d8->column_indexes;
  (*pMVar17->_vptr_MultiFileReader[9])
            (&file_name,pMVar17,context,&data->file_options,&data->reader_bind,local_d0,pvVar37,
             local_68._16_8_);
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  _Var11 = file_name.path._M_dataplus;
  pMVar24 = local_d0;
  file_name.path._M_dataplus._M_p = (pointer)0x0;
  _Var3._M_head_impl =
       (pMVar16->multi_file_reader_state).
       super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
       .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl;
  (pMVar16->multi_file_reader_state).
  super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
  .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl =
       (MultiFileReaderGlobalState *)_Var11._M_p;
  if ((_Var3._M_head_impl != (MultiFileReaderGlobalState *)0x0) &&
     ((**(code **)((long)(_Var3._M_head_impl)->_vptr_MultiFileReaderGlobalState + 8))(),
     file_name.path._M_dataplus._M_p != (pointer)0x0)) {
    (**(code **)(*(long *)file_name.path._M_dataplus._M_p + 8))();
  }
  local_68._8_8_ = this;
  bVar12 = MultiFileList::IsEmpty(pMVar24);
  if (bVar12) {
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_e0);
LAB_01b462fd:
    file_name.path.field_2._M_allocated_capacity =
         (size_type)
         (pMVar16->readers).
         super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pMVar16->readers).
    super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)table_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    file_name.path._M_dataplus._M_p =
         (pointer)(pMVar16->readers).
                  super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    file_name.path._M_string_length =
         (size_type)
         (pMVar16->readers).
         super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pMVar16->readers).
    super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)table_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    (pMVar16->readers).
    super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)table_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
               *)&file_name);
    ::std::
    vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
               *)&table_types);
  }
  else {
    psVar39 = (data->union_readers).
              super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (data->union_readers).
             super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar39 == psVar4) {
      if ((data->initial_reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        pBVar23 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&data->initial_reader);
        MultiFileList::GetFirstFile(&file_name,local_d0);
        __n = (pBVar23->file).path._M_string_length;
        if (__n == file_name.path._M_string_length) {
          if (__n == 0) {
            bVar12 = true;
          }
          else {
            iVar13 = bcmp((pBVar23->file).path._M_dataplus._M_p,file_name.path._M_dataplus._M_p,__n)
            ;
            bVar12 = iVar13 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (file_name.extended_info.internal.
            super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     file_name.extended_info.internal.
                     super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)file_name.path._M_dataplus._M_p != &file_name.path.field_2) {
          operator_delete(file_name.path._M_dataplus._M_p);
        }
        if (bVar12) {
          pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                  *)&local_e0);
          pMVar18 = (MultiFileReaderData *)operator_new(0xa0);
          file_name.path._M_dataplus._M_p =
               (pointer)(data->initial_reader).internal.
                        super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          file_name.path._M_string_length =
               (size_type)
               (data->initial_reader).internal.
               super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          (data->initial_reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (data->initial_reader).internal.
          super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          MultiFileReaderData::MultiFileReaderData
                    (pMVar18,(shared_ptr<duckdb::BaseFileReader,_true> *)&file_name);
          table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pMVar18;
          if (file_name.path._M_string_length != 0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       file_name.path._M_string_length);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                      *)&pMVar16->readers,
                     (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                      *)&table_types);
          pLVar33 = table_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            MultiFileReaderData::~MultiFileReaderData
                      ((MultiFileReaderData *)
                       table_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            operator_delete(pLVar33);
          }
        }
      }
    }
    else {
      unaff_RBP = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&table_types;
      do {
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_e0);
        pMVar18 = (MultiFileReaderData *)operator_new(0xa0);
        file_name.path._M_dataplus._M_p =
             (pointer)(psVar39->internal).
                      super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        file_name.path._M_string_length =
             (size_type)
             (psVar39->internal).
             super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           file_name.path._M_string_length)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           file_name.path._M_string_length)->_M_use_count + 1;
          }
        }
        MultiFileReaderData::MultiFileReaderData
                  (pMVar18,(shared_ptr<duckdb::BaseUnionData,_true> *)&file_name);
        table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pMVar18;
        if (file_name.path._M_string_length != 0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_name.path._M_string_length
                    );
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>,std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,std::default_delete<duckdb::MultiFileReaderData>,true>>>
                    *)&pMVar16->readers,
                   (unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    *)&unaff_RBP->_M_allocated_capacity);
        pLVar33 = table_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          MultiFileReaderData::~MultiFileReaderData
                    ((MultiFileReaderData *)
                     table_types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          operator_delete(pLVar33);
        }
        psVar39 = psVar39 + 1;
      } while (psVar39 != psVar4);
      pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                              *)&local_e0);
      puVar32 = (pMVar16->readers).
                super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (pMVar16->readers).
               super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar13 = (*local_d0->_vptr_MultiFileList[6])();
      if ((long)puVar5 - (long)puVar32 >> 3 != CONCAT44(extraout_var,iVar13)) {
        table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_e0);
        goto LAB_01b462fd;
      }
    }
  }
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  LOCK();
  (pMVar16->file_index).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  global_state = (MultiFileBindData *)local_68._16_8_;
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::operator=
            (&(pMVar16->column_indexes).
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
             (vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)local_68._16_8_);
  pTVar6 = (local_d8->filters).ptr;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  (pMVar16->filters).ptr = pTVar6;
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator*((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
               *)&local_e0);
  _Var19._M_head_impl = (GlobalTableFunctionState *)operator_new(0x18);
  (_Var19._M_head_impl)->_vptr_GlobalTableFunctionState = (_func_int **)0x0;
  _Var19._M_head_impl[1]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
  _Var19._M_head_impl[2]._vptr_GlobalTableFunctionState = (_func_int **)0x0;
  (_Var19._M_head_impl)->_vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__GlobalTableFunctionState_02473fd0;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  _Var7._M_head_impl =
       (pMVar16->global_state).
       super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
  (pMVar16->global_state).
  super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       _Var19._M_head_impl;
  if (_Var7._M_head_impl != (GlobalTableFunctionState *)0x0) {
    (*(_Var7._M_head_impl)->_vptr_GlobalTableFunctionState[1])();
  }
  this_01 = TaskScheduler::GetScheduler(context);
  val = TaskScheduler::NumberOfThreads(this_01);
  uVar20 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  pMVar16->max_threads = uVar20;
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  puVar32 = (pMVar16->readers).
            super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (pMVar16->readers).
             super_vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar32 != (pointer)local_48) {
    unaff_RBP = &file_name.path.field_2;
    do {
      file_name.path._M_string_length = 0;
      file_name.path.field_2._M_allocated_capacity =
           file_name.path.field_2._M_allocated_capacity & 0xffffffffffffff00;
      file_name.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      file_name.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      file_name.path._M_dataplus._M_p = (pointer)unaff_RBP;
      pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                              *)&local_e0);
      iVar25 = (pMVar16->file_list_scan).current_file_idx;
      pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                              *)&local_e0);
      global_state = (MultiFileBindData *)&pMVar16->file_list_scan;
      MultiFileList::Scan(local_d0,(MultiFileListScanData *)global_state,&file_name);
      pMVar21 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                ::operator->(puVar32);
      if ((pMVar21->union_data).internal.
          super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pMVar21 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  ::operator->(puVar32);
        pBVar23 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(&pMVar21->reader);
        if ((file_name.path._M_string_length != (pBVar23->file).path._M_string_length) ||
           ((file_name.path._M_string_length != 0 &&
            (iVar13 = bcmp(file_name.path._M_dataplus._M_p,(pBVar23->file).path._M_dataplus._M_p,
                           file_name.path._M_string_length), iVar13 != 0)))) {
          pIVar30 = (InternalException *)__cxa_allocate_exception(0x10);
          table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&table_types.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&table_types,
                     "Mismatch in filename order and reader order in multi file scan","");
          InternalException::InternalException(pIVar30,(string *)&table_types);
          __cxa_throw(pIVar30,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        reader_data = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                      ::operator*(puVar32);
        table_filters.ptr = (local_d8->filters).ptr;
        optional_idx::optional_idx(&local_38,iVar25);
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_e0);
        global_state = data;
        RVar14 = InitializeReader(reader_data,data,
                                  (vector<duckdb::ColumnIndex,_true> *)local_68._16_8_,table_filters
                                  ,context,local_38,
                                  (optional_ptr<duckdb::MultiFileReaderGlobalState,_true>)
                                  (pMVar16->multi_file_reader_state).
                                  super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
                                  .
                                  super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>
                                  ._M_head_impl);
        if (RVar14 == SKIP_READING_FILE) {
          pMVar21 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    ::operator->(puVar32);
          pMVar21->file_state = SKIPPED;
          pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                    ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                  *)&local_e0);
          LOCK();
          (pMVar16->file_index).super___atomic_base<unsigned_long>._M_i =
               (pMVar16->file_index).super___atomic_base<unsigned_long>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        pMVar21 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                  ::operator->(puVar32);
        pBVar22 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(&pMVar21->union_data);
        if (file_name.path._M_string_length != (pBVar22->file).path._M_string_length) {
LAB_01b46a0c:
          pIVar30 = (InternalException *)__cxa_allocate_exception(0x10);
          table_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&table_types.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&table_types,
                     "Mismatch in filename order and union reader order in multi file scan","");
          InternalException::InternalException(pIVar30,(string *)&table_types);
          __cxa_throw(pIVar30,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (file_name.path._M_string_length != 0) {
          global_state = (MultiFileBindData *)(pBVar22->file).path._M_dataplus._M_p;
          iVar13 = bcmp(file_name.path._M_dataplus._M_p,global_state,file_name.path._M_string_length
                       );
          if (iVar13 != 0) goto LAB_01b46a0c;
        }
      }
      if (file_name.extended_info.internal.
          super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   file_name.extended_info.internal.
                   super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)file_name.path._M_dataplus._M_p != unaff_RBP) {
        operator_delete(file_name.path._M_dataplus._M_p);
      }
      puVar32 = puVar32 + 1;
    } while (puVar32 != (pointer)local_48);
  }
  pMVar24 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&data->file_list);
  iVar13 = (*pMVar24->_vptr_MultiFileList[5])(pMVar24);
  unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
  ::operator*((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
               *)&local_e0);
  uVar38._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true,_true>
        )(__uniq_ptr_data<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true,_true>
          )local_68._8_8_;
  max_threads = ParquetMultiFileInfo::MaxThreads
                          (data,(MultiFileGlobalState *)global_state,(FileExpandResult)iVar13);
  if (max_threads.index != 0xffffffffffffffff) {
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_e0);
    uVar8 = pMVar16->max_threads;
    iVar25 = optional_idx::GetIndex(&max_threads);
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_e0);
    if (uVar8 < iVar25) {
      iVar25 = uVar8;
    }
    pMVar16->max_threads = iVar25;
  }
  pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                          *)&local_e0);
  if ((pMVar16->multi_file_reader_state).
      super_unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileReaderGlobalState_*,_std::default_delete<duckdb::MultiFileReaderGlobalState>_>
      .super__Head_base<0UL,_duckdb::MultiFileReaderGlobalState_*,_false>._M_head_impl ==
      (MultiFileReaderGlobalState *)0x0) {
    puVar31 = (local_d8->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
              .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar27 = (local_d8->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
              .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (puVar31 == puVar27) goto LAB_01b46909;
    uVar34 = 0;
LAB_01b466a7:
    __x_00 = &local_d8->projection_ids;
    if (((char)uVar34 == '\0') &&
       ((long)puVar27 - (long)puVar31 ==
        (long)(local_d8->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(local_d8->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start)) goto LAB_01b46909;
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_e0);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pMVar16->projection_ids,
               &__x_00->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_e0);
    pMVar26 = unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
              ::operator->(&pMVar16->multi_file_reader_state);
    pLVar33 = (pMVar26->extra_columns).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar9 = (pMVar26->extra_columns).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar35 = (undefined7)((ulong)unaff_RBP >> 8);
    uVar34 = (undefined4)CONCAT71(uVar35,pLVar33 != pLVar9);
    puVar31 = (local_d8->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
              .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar27 = (local_d8->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
              .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (puVar31 != puVar27) goto LAB_01b466a7;
    if (pLVar33 == pLVar9) goto LAB_01b46909;
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_e0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pMVar16->projection_ids,
               (long)(local_d8->column_indexes).
                     super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_d8->column_indexes).
                     super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 5);
    if ((local_d8->column_indexes).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (local_d8->column_indexes).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar34 = (undefined4)CONCAT71(uVar35,1);
    }
    else {
      __n_00 = 0;
      do {
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_e0);
        pvVar28 = vector<unsigned_long,_true>::operator[](&pMVar16->projection_ids,__n_00);
        *pvVar28 = __n_00;
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)((long)(local_d8->column_indexes).
                                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      .
                                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_d8->column_indexes).
                                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      .
                                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  local_d0 = (MultiFileList *)CONCAT44(local_d0._4_4_,uVar34);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&table_types,
             &(data->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
  ;
  pCVar40 = (local_d8->column_indexes).
            super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
            super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar10 = (local_d8->column_indexes).
            super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
            super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pCVar40 != pCVar10) {
    do {
      column_id = pCVar40->index;
      if (column_id < 0x8000000000000000) {
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_e0);
        __x = vector<duckdb::LogicalType,_true>::operator[](&table_types,column_id);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   &pMVar16->scanned_types,__x);
      }
      else {
        iVar29 = ::std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(data->virtual_columns)._M_h,&column_id);
        if (iVar29.
            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
            _M_cur == (__node_type *)0x0) {
          pIVar30 = (InternalException *)__cxa_allocate_exception(0x10);
          file_name.path._M_dataplus._M_p = (pointer)&file_name.path.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&file_name,"MultiFileReader - virtual column definition not found",""
                    );
          InternalException::InternalException(pIVar30,&file_name.path);
          __cxa_throw(pIVar30,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_e0);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                   &pMVar16->scanned_types,
                   (LogicalType *)
                   ((long)iVar29.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                          ._M_cur + 0x30));
      }
      pCVar40 = pCVar40 + 1;
    } while (pCVar40 != pCVar10);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&table_types);
  uVar38._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true,_true>
        )(__uniq_ptr_data<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true,_true>
          )local_68._8_8_;
  if ((char)local_d0 != '\0') {
    pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
              ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                            *)&local_e0);
    pMVar26 = unique_ptr<duckdb::MultiFileReaderGlobalState,_std::default_delete<duckdb::MultiFileReaderGlobalState>,_true>
              ::operator->(&pMVar16->multi_file_reader_state);
    pLVar33 = (pMVar26->extra_columns).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar9 = (pMVar26->extra_columns).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pLVar33 != pLVar9) {
      do {
        pMVar16 = unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                  ::operator->((unique_ptr<duckdb::MultiFileGlobalState,_std::default_delete<duckdb::MultiFileGlobalState>,_true>
                                *)&local_e0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   &pMVar16->scanned_types,pLVar33);
        pLVar33 = pLVar33 + 1;
      } while (pLVar33 != pLVar9);
    }
  }
LAB_01b46909:
  _Var36._M_head_impl = local_e0._M_head_impl;
  local_e0._M_head_impl = (MultiFileGlobalState *)0x0;
  *(MultiFileGlobalState **)
   uVar38._M_t.
   super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
   ._M_t.
   super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
   .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       _Var36._M_head_impl;
  if (((_func_int **)local_68._0_8_ != (_func_int **)0x0) &&
     ((**(code **)(*(_func_int **)local_68._0_8_ + 8))(),
     local_e0._M_head_impl != (MultiFileGlobalState *)0x0)) {
    (*((local_e0._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )uVar38._M_t.
             super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<GlobalTableFunctionState> MultiFileInitGlobal(ClientContext &context,
	                                                                TableFunctionInitInput &input) {
		auto &bind_data = input.bind_data->CastNoConst<MultiFileBindData>();
		unique_ptr<MultiFileGlobalState> result;

		// before instantiating a scan trigger a dynamic filter pushdown if possible
		auto new_list = MultiFileFilterPushdown(context, bind_data, input.column_ids, input.filters);
		if (new_list) {
			result = make_uniq<MultiFileGlobalState>(std::move(new_list));
		} else {
			result = make_uniq<MultiFileGlobalState>(*bind_data.file_list);
		}
		auto &file_list = result->file_list;
		file_list.InitializeScan(result->file_list_scan);

		auto &global_columns = bind_data.reader_bind.schema.empty() ? bind_data.columns : bind_data.reader_bind.schema;
		result->multi_file_reader_state = bind_data.multi_file_reader->InitializeGlobalState(
		    context, bind_data.file_options, bind_data.reader_bind, file_list, global_columns, input.column_indexes);

		if (file_list.IsEmpty()) {
			result->readers = {};
		} else if (!bind_data.union_readers.empty()) {
			for (auto &reader : bind_data.union_readers) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(reader));
			}
			if (result->readers.size() != file_list.GetTotalFileCount()) {
				result->readers = {};
			}
		} else if (bind_data.initial_reader) {
			// we can only use the initial reader if it was constructed from the first file
			if (bind_data.initial_reader->GetFileName() == file_list.GetFirstFile().path) {
				result->readers.push_back(make_uniq<MultiFileReaderData>(std::move(bind_data.initial_reader)));
			}
		}

		result->file_index = 0;
		result->column_indexes = input.column_indexes;
		result->filters = input.filters.get();
		result->global_state = OP::InitializeGlobalState(context, bind_data, *result);
		result->max_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads());

		// Ensure all readers are initialized and FileListScan is sync with readers list
		for (auto &reader_data : result->readers) {
			OpenFileInfo file_name;
			idx_t file_idx = result->file_list_scan.current_file_idx;
			file_list.Scan(result->file_list_scan, file_name);
			if (reader_data->union_data) {
				if (file_name.path != reader_data->union_data->GetFileName()) {
					throw InternalException("Mismatch in filename order and union reader order in multi file scan");
				}
			} else {
				D_ASSERT(reader_data->reader);
				if (file_name.path != reader_data->reader->GetFileName()) {
					throw InternalException("Mismatch in filename order and reader order in multi file scan");
				}
				auto init_result = InitializeReader(*reader_data, bind_data, input.column_indexes, input.filters,
				                                    context, file_idx, result->multi_file_reader_state);
				if (init_result == ReaderInitializeType::SKIP_READING_FILE) {
					//! File can be skipped entirely, close it and move on
					reader_data->file_state = MultiFileFileState::SKIPPED;
					result->file_index++;
				}
			}
		}

		auto expand_result = bind_data.file_list->GetExpandResult();
		auto max_threads = OP::MaxThreads(bind_data, *result, expand_result);
		if (max_threads.IsValid()) {
			result->max_threads = MinValue<idx_t>(result->max_threads, max_threads.GetIndex());
		}
		bool require_extra_columns =
		    result->multi_file_reader_state && result->multi_file_reader_state->RequiresExtraColumns();
		if (input.CanRemoveFilterColumns() || require_extra_columns) {
			if (!input.projection_ids.empty()) {
				result->projection_ids = input.projection_ids;
			} else {
				result->projection_ids.resize(input.column_indexes.size());
				for (idx_t i = 0; i < input.column_indexes.size(); i++) {
					result->projection_ids[i] = i;
				}
			}

			const auto table_types = bind_data.types;
			for (const auto &col_idx : input.column_indexes) {
				auto column_id = col_idx.GetPrimaryIndex();
				if (col_idx.IsVirtualColumn()) {
					auto entry = bind_data.virtual_columns.find(column_id);
					if (entry == bind_data.virtual_columns.end()) {
						throw InternalException("MultiFileReader - virtual column definition not found");
					}
					result->scanned_types.emplace_back(entry->second.type);
				} else {
					result->scanned_types.push_back(table_types[column_id]);
				}
			}
		}
		if (require_extra_columns) {
			for (const auto &column_type : result->multi_file_reader_state->extra_columns) {
				result->scanned_types.push_back(column_type);
			}
		}
		return std::move(result);
	}